

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp9d_parser.c
# Opt level: O3

RK_S32 vp9_parser_frame(Vp9CodecContext *ctx,HalDecTask *task)

{
  VP9Context *s;
  void *pvVar1;
  HalDecTask *pHVar2;
  byte bVar3;
  RK_S32 RVar4;
  int iVar5;
  RockchipSocType RVar6;
  RK_U8 *data;
  size_t sVar7;
  RK_S64 RVar8;
  RefInfo *pRVar9;
  RK_U8 (*paaaaaRVar10) [2] [2] [6] [6] [3];
  RK_U8 (*paaaaaRVar11) [2] [2] [6] [6] [3];
  code *val;
  ulong uVar12;
  long lVar13;
  RK_U32 RVar14;
  MppFrameFormat v;
  bool bVar15;
  long lVar16;
  bool bVar17;
  RK_U8 (*paaaRVar18) [6] [6] [3];
  VP9Frame *pVVar19;
  long lVar20;
  int iVar21;
  RK_U8 (*paaaRVar22) [6] [6] [3];
  bool bVar23;
  RK_S32 ref;
  MppFrame frame;
  RK_S32 local_5c;
  MppFrame local_58;
  HalDecTask *local_50;
  anon_struct_2039_2_dbdf8fd7 *local_48;
  Vp9CodecContext *local_40;
  VP9Frame *local_38;
  
  s = (VP9Context *)ctx->priv_data;
  local_5c = 0;
  if (((byte)vp9d_debug & 1) != 0) {
    _mpp_log_l(4,(char *)0x0,"%s",(char *)0x0,"vp9_parser_frame");
  }
  task->valid = 0xffffffff;
  data = (RK_U8 *)mpp_packet_get_pos(ctx->pkt);
  sVar7 = mpp_packet_get_length(ctx->pkt);
  RVar8 = mpp_packet_get_pts(ctx->pkt);
  s->pts = RVar8;
  iVar21 = (int)sVar7;
  if (((byte)vp9d_debug & 2) != 0) {
    _mpp_log_l(4,(char *)0x0,"data size %d",(char *)0x0,sVar7 & 0xffffffff);
  }
  if (iVar21 < 1) {
LAB_001b2b35:
    RVar4 = 0;
  }
  else {
    RVar4 = decode_parser_header(ctx,data,iVar21,&local_5c);
    if (RVar4 < 0) {
      return RVar4;
    }
    if (RVar4 == 0) {
      lVar16 = (long)local_5c;
      if (s->refs[lVar16].ref != (RefInfo *)0x0) {
        local_58 = (MppFrame)0x0;
        mpp_buf_slot_get_prop(s->slots,s->refs[lVar16].slot_index,SLOT_FRAME_PTR,&local_58);
        mpp_frame_set_pts(local_58,s->pts);
        mpp_buf_slot_set_flag(s->slots,s->refs[lVar16].slot_index,SLOT_QUEUE_USE);
        mpp_buf_slot_enqueue(s->slots,s->refs[lVar16].slot_index,QUEUE_DISPLAY);
        (s->refs[lVar16].ref)->is_output = 1;
        s->outframe_num = s->outframe_num + 1;
        _mpp_log_l(4,(char *)0x0,"out repeat num %d",(char *)0x0);
        return iVar21;
      }
    }
    else {
      local_50 = task;
      if (s->frames[1].ref != (RefInfo *)0x0) {
        vp9_unref_frame(s,s->frames + 1);
      }
      pVVar19 = s->frames;
      if ((((s->intraonly != '\0') || (s->keyframe != '\0')) || (s->errorres != '\0')) ||
         ((s->frames[0].ref == (RefInfo *)0x0 ||
          (RVar4 = vp9_ref_frame((Vp9CodecContext *)ctx->priv_data,s->frames + 1,pVVar19),
          -1 < RVar4)))) {
        if (s->frames[0].ref != (RefInfo *)0x0) {
          vp9_unref_frame(s,pVVar19);
        }
        pvVar1 = ctx->priv_data;
        mpp_frame_set_width(pVVar19->f,ctx->width);
        mpp_frame_set_height(pVVar19->f,ctx->height);
        iVar5 = (uint)*(byte *)((long)pvVar1 + 0xd4) * ctx->width;
        iVar21 = iVar5 + 7;
        if (-1 < iVar5) {
          iVar21 = iVar5;
        }
        mpp_frame_set_hor_stride(pVVar19->f,iVar21 >> 3);
        mpp_frame_set_ver_stride(pVVar19->f,ctx->height);
        mpp_frame_set_errinfo(pVVar19->f,0);
        mpp_frame_set_discard(pVVar19->f,0);
        mpp_frame_set_pts(pVVar19->f,*(RK_S64 *)((long)pvVar1 + 0x70d8));
        RVar14 = *(int *)((long)pvVar1 + 0x70e8) + 1;
        *(RK_U32 *)((long)pvVar1 + 0x70e8) = RVar14;
        mpp_frame_set_poc(pVVar19->f,RVar14);
        if ((*(byte *)(*(long *)((long)pvVar1 + 0x70b8) + 0x1a) & 0xf0) == 0) {
          RVar6 = mpp_get_soc_type();
          if (RVar6 == ROCKCHIP_SOC_RK3576) {
            val = mpp_align_128_odd_plus_64;
          }
          else {
            val = mpp_align_256_odd;
          }
          mpp_slots_set_prop(*(MppBufSlots *)((long)pvVar1 + 0x70a8),SLOTS_HOR_ALIGN,val);
          mpp_slots_set_prop(*(MppBufSlots *)((long)pvVar1 + 0x70a8),SLOTS_VER_ALIGN,mpp_align_64);
          v = ctx->pix_fmt;
          if ((*(byte *)(*(long *)((long)pvVar1 + 0x70b8) + 0x1b) & 2) != 0) {
            v = v | 0x2000000;
          }
          mpp_frame_set_fmt(pVVar19->f,v);
        }
        else {
          RVar14 = mpp_align_64(ctx->width);
          mpp_slots_set_prop(*(MppBufSlots *)((long)pvVar1 + 0x70a8),SLOTS_HOR_ALIGN,mpp_align_64);
          mpp_frame_set_fmt(pVVar19->f,
                            *(MppFrameFormat *)(*(long *)((long)pvVar1 + 0x70b8) + 0x18) & 0xf00000
                            | ctx->pix_fmt);
          if (*compat_ext_fbc_hdr_256_odd != 0) {
            RVar14 = mpp_align_256_odd(ctx->width);
          }
          mpp_frame_set_fbc_hdr_stride(pVVar19->f,RVar14);
        }
        RVar14 = *(RK_U32 *)(*(long *)((long)pvVar1 + 0x70b8) + 0x40);
        if ((RVar14 == 0) || ((*(byte *)(*(long *)((long)pvVar1 + 0x70c0) + 6) & 8) == 0)) {
          RVar14 = 0;
        }
        local_38 = pVVar19;
        mpp_frame_set_thumbnail_en(s->frames[0].f,RVar14);
        mpp_buf_slot_get_unused(*(MppBufSlots *)((long)pvVar1 + 0x70a8),&s->frames[0].slot_index);
        mpp_buf_slot_set_prop
                  (*(MppBufSlots *)((long)pvVar1 + 0x70a8),s->frames[0].slot_index,SLOT_FRAME,
                   s->frames[0].f);
        mpp_buf_slot_set_flag
                  (*(MppBufSlots *)((long)pvVar1 + 0x70a8),s->frames[0].slot_index,SLOT_CODEC_USE);
        mpp_buf_slot_set_flag
                  (*(MppBufSlots *)((long)pvVar1 + 0x70a8),s->frames[0].slot_index,SLOT_HAL_OUTPUT);
        pRVar9 = (RefInfo *)mpp_osal_calloc("vp9_alloc_frame",0x10);
        s->frames[0].ref = pRVar9;
        pRVar9->ref_count = pRVar9->ref_count + 1;
        pRVar9->invisible = (uint)*(byte *)((long)pvVar1 + 0xd7);
        pRVar9->is_output = 0;
        if ((s->refreshctx != '\0') && (s->parallelmode != '\0')) {
          local_48 = s->prob_ctx;
          paaaaaRVar10 = (s->prob).coef;
          paaaaaRVar11 = s->prob_ctx[0].coef;
          uVar12 = 0;
          do {
            lVar16 = 0;
            bVar23 = true;
            do {
              bVar15 = bVar23;
              lVar13 = 0;
              bVar23 = true;
              do {
                bVar17 = bVar23;
                paaaRVar18 = (*paaaaaRVar11)[lVar16] + lVar13;
                paaaRVar22 = (*paaaaaRVar10)[lVar16] + lVar13;
                lVar13 = 0;
                do {
                  lVar20 = 0;
                  do {
                    bVar3 = s->framectxid;
                    *(RK_U8 *)((long)paaaRVar18 + lVar20 + 2 + (ulong)bVar3 * 0x7f7) =
                         (*paaaRVar22)[0][0][lVar20 + 2];
                    *(undefined2 *)((long)paaaRVar18 + lVar20 + (ulong)bVar3 * 0x7f7) =
                         *(undefined2 *)((*paaaRVar22)[0][0] + lVar20);
                    lVar20 = lVar20 + 3;
                  } while (lVar20 != 0x12);
                  lVar13 = lVar13 + 1;
                  paaaRVar18 = (RK_U8 (*) [6] [6] [3])(*paaaRVar18 + 1);
                  paaaRVar22 = (RK_U8 (*) [6] [6] [3])(*paaaRVar22 + 1);
                } while (lVar13 != 6);
                lVar13 = 1;
                bVar23 = false;
              } while (bVar17);
              lVar16 = 1;
              bVar23 = false;
            } while (bVar15);
            if (uVar12 == s->txfmmode) break;
            uVar12 = uVar12 + 1;
            paaaaaRVar11 = paaaaaRVar11 + 1;
            paaaaaRVar10 = paaaaaRVar10 + 1;
          } while (uVar12 != 4);
          local_40 = ctx;
          memcpy(local_48 + s->framectxid,&s->prob,0x137);
          ctx = local_40;
        }
        pHVar2 = local_50;
        vp9d_parser2_syntax(ctx);
        (pHVar2->syntax).data = &ctx->pic_params;
        (pHVar2->syntax).number = 1;
        pHVar2->valid = 1;
        pHVar2->output = s->frames[0].slot_index;
        pHVar2->input_packet = ctx->pkt;
        pVVar19 = s->refs;
        lVar16 = 0;
        do {
          RVar4 = s->refs[s->refidx[lVar16]].slot_index;
          if (RVar4 < 0x7f) {
            local_58 = (MppFrame)0x0;
            mpp_buf_slot_set_flag(s->slots,RVar4,SLOT_HAL_INPUT);
            RVar4 = s->refs[s->refidx[lVar16]].slot_index;
            pHVar2->refer[lVar16] = RVar4;
            mpp_buf_slot_get_prop(s->slots,RVar4,SLOT_FRAME_PTR,&local_58);
            if (((local_58 != (MppFrame)0x0) && (s->keyframe == '\0')) && (s->intraonly == '\0')) {
              RVar14 = mpp_frame_get_errinfo(local_58);
              (pHVar2->flags).val =
                   (pHVar2->flags).val & 0xfffffffffffffff7 |
                   (ulong)((RVar14 << 3 | (uint)(pHVar2->flags).val) & 8);
            }
          }
          else {
            pHVar2->refer[lVar16] = -1;
          }
          lVar16 = lVar16 + 1;
        } while (lVar16 != 3);
        if (((byte)vp9d_debug & 4) != 0) {
          _mpp_log_l(4,(char *)0x0,"ref_errinfo=%d\n",(char *)0x0,
                     (ulong)(*(uint *)&pHVar2->flags >> 3 & 1));
        }
        if (s->eos != 0) {
          *(byte *)&pHVar2->flags = *(byte *)&pHVar2->flags | 1;
        }
        if (s->invisible == '\0') {
          mpp_buf_slot_set_flag(s->slots,s->frames[0].slot_index,SLOT_QUEUE_USE);
          mpp_buf_slot_enqueue(s->slots,s->frames[0].slot_index,QUEUE_DISPLAY);
        }
        if (((byte)vp9d_debug & 4) != 0) {
          _mpp_log_l(4,(char *)0x0,"s->refreshrefmask = %d s->frames[CUR_FRAME] = %d",(char *)0x0,
                     (ulong)s->refreshrefmask,(ulong)(uint)s->frames[0].slot_index);
        }
        lVar16 = 0xed;
        do {
          bVar3 = *(byte *)((long)&(s->gb).data_ + lVar16);
          if ((s->refs[bVar3].ref != (RefInfo *)0x0) && (((byte)vp9d_debug & 4) != 0)) {
            _mpp_log_l(4,(char *)0x0,"ref buf select %d",(char *)0x0,
                       (ulong)(uint)pVVar19[bVar3].slot_index);
          }
          lVar16 = lVar16 + 1;
        } while (lVar16 != 0xf0);
        uVar12 = 0;
        do {
          bVar3 = s->refreshrefmask;
          if (((byte)vp9d_debug & 4) != 0) {
            _mpp_log_l(4,(char *)0x0,"s->refreshrefmask = 0x%x",(char *)0x0,(ulong)bVar3);
            bVar3 = s->refreshrefmask;
          }
          if ((bVar3 >> ((uint)uVar12 & 0x1f) & 1) == 0) {
            bVar3 = 0;
          }
          else {
            if (pVVar19->ref != (RefInfo *)0x0) {
              vp9_unref_frame(s,pVVar19);
            }
            if (((byte)vp9d_debug & 4) != 0) {
              _mpp_log_l(4,(char *)0x0,"update ref index in %d",(char *)0x0,uVar12 & 0xffffffff);
            }
            RVar4 = vp9_ref_frame((Vp9CodecContext *)ctx->priv_data,pVVar19,local_38);
            bVar3 = (byte)((uint)RVar4 >> 0x1f);
          }
          if ((pVVar19->ref != (RefInfo *)0x0) && (((byte)vp9d_debug & 4) != 0)) {
            _mpp_log_l(4,(char *)0x0,"s->refs[%d] = %d",(char *)0x0,uVar12 & 0xffffffff,
                       (ulong)(uint)pVVar19->slot_index);
          }
          bVar23 = uVar12 == 7;
          uVar12 = uVar12 + 1;
          pVVar19 = pVVar19 + 1;
        } while ((bVar3 | bVar23) != 1);
        goto LAB_001b2b35;
      }
    }
    RVar4 = -1;
  }
  return RVar4;
}

Assistant:

RK_S32 vp9_parser_frame(Vp9CodecContext *ctx, HalDecTask *task)
{

    const RK_U8 *data = NULL;
    RK_S32 size = 0;
    VP9Context *s = (VP9Context *)ctx->priv_data;
    RK_S32 res, i, ref = 0;

    vp9d_dbg(VP9D_DBG_FUNCTION, "%s", __FUNCTION__);
    task->valid = -1;
#ifdef dump
    dec_num++;
#endif
    data = (const RK_U8 *)mpp_packet_get_pos(ctx->pkt);
    size = (RK_S32)mpp_packet_get_length(ctx->pkt);

    s->pts = mpp_packet_get_pts(ctx->pkt);

    vp9d_dbg(VP9D_DBG_HEADER, "data size %d", size);
    if (size <= 0) {
        return MPP_OK;
    }
    if ((res = decode_parser_header(ctx, data, size, &ref)) < 0) {
        return res;
    } else if (res == 0) {
        if (!s->refs[ref].ref) {
            //mpp_err("Requested reference %d not available\n", ref);
            return -1;//AVERROR_INVALIDDATA;
        }
        {
            MppFrame frame = NULL;

            mpp_buf_slot_get_prop(s->slots, s->refs[ref].slot_index, SLOT_FRAME_PTR, &frame);
            mpp_frame_set_pts(frame, s->pts);
            mpp_buf_slot_set_flag(s->slots, s->refs[ref].slot_index, SLOT_QUEUE_USE);
            mpp_buf_slot_enqueue(s->slots, s->refs[ref].slot_index, QUEUE_DISPLAY);
            s->refs[ref].ref->is_output = 1;
        }

        mpp_log("out repeat num %d", s->outframe_num++);
        return size;
    }
    data += res;
    size -= res;

    if (s->frames[REF_FRAME_MVPAIR].ref)
        vp9_unref_frame(s, &s->frames[REF_FRAME_MVPAIR]);

    if (!s->intraonly && !s->keyframe && !s->errorres && s->frames[CUR_FRAME].ref) {
        if ((res = vp9_ref_frame(ctx, &s->frames[REF_FRAME_MVPAIR], &s->frames[CUR_FRAME])) < 0)
            return res;
    }

    if (s->frames[CUR_FRAME].ref)
        vp9_unref_frame(s, &s->frames[CUR_FRAME]);

    if ((res = vp9_alloc_frame(ctx, &s->frames[CUR_FRAME])) < 0)
        return res;

    if (s->refreshctx && s->parallelmode) {
        RK_S32 j, k, l, m;

        for (i = 0; i < 4; i++) {
            for (j = 0; j < 2; j++)
                for (k = 0; k < 2; k++)
                    for (l = 0; l < 6; l++)
                        for (m = 0; m < 6; m++)
                            memcpy(s->prob_ctx[s->framectxid].coef[i][j][k][l][m],
                                   s->prob.coef[i][j][k][l][m], 3);
            if ((RK_S32)s->txfmmode == i)
                break;
        }
        s->prob_ctx[s->framectxid].p = s->prob.p;
    }

    vp9d_parser2_syntax(ctx);

    task->syntax.data = (void*)&ctx->pic_params;
    task->syntax.number = 1;
    task->valid = 1;
    task->output = s->frames[CUR_FRAME].slot_index;
    task->input_packet = ctx->pkt;

    for (i = 0; i < 3; i++) {
        if (s->refs[s->refidx[i]].slot_index < 0x7f) {
            MppFrame mframe = NULL;
            mpp_buf_slot_set_flag(s->slots, s->refs[s->refidx[i]].slot_index, SLOT_HAL_INPUT);
            task->refer[i] = s->refs[s->refidx[i]].slot_index;
            mpp_buf_slot_get_prop(s->slots, task->refer[i], SLOT_FRAME_PTR, &mframe);
            if (mframe && !s->keyframe && !s->intraonly)
                task->flags.ref_err |= mpp_frame_get_errinfo(mframe);
        } else {
            task->refer[i] = -1;
        }
    }

    vp9d_dbg(VP9D_DBG_REF, "ref_errinfo=%d\n", task->flags.ref_err);
    if (s->eos) {
        task->flags.eos = 1;
    }

    if (!s->invisible) {
        mpp_buf_slot_set_flag(s->slots,  s->frames[CUR_FRAME].slot_index, SLOT_QUEUE_USE);
        mpp_buf_slot_enqueue(s->slots, s->frames[CUR_FRAME].slot_index, QUEUE_DISPLAY);
    }
    vp9d_dbg(VP9D_DBG_REF, "s->refreshrefmask = %d s->frames[CUR_FRAME] = %d",
             s->refreshrefmask, s->frames[CUR_FRAME].slot_index);
    for (i = 0; i < 3; i++) {
        if (s->refs[s->refidx[i]].ref != NULL) {
            vp9d_dbg(VP9D_DBG_REF, "ref buf select %d", s->refs[s->refidx[i]].slot_index);
        }
    }
    // ref frame setup
    for (i = 0; i < 8; i++) {
        vp9d_dbg(VP9D_DBG_REF, "s->refreshrefmask = 0x%x", s->refreshrefmask);
        res = 0;
        if (s->refreshrefmask & (1 << i)) {
            if (s->refs[i].ref)
                vp9_unref_frame(s, &s->refs[i]);
            vp9d_dbg(VP9D_DBG_REF, "update ref index in %d", i);
            res = vp9_ref_frame(ctx, &s->refs[i], &s->frames[CUR_FRAME]);
        }

        if (s->refs[i].ref)
            vp9d_dbg(VP9D_DBG_REF, "s->refs[%d] = %d", i, s->refs[i].slot_index);
        if (res < 0)
            return 0;
    }
    return 0;
}